

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QPersistentModelIndex,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  QDebug *in_RSI;
  long in_FS_OFFSET;
  QDebug local_18;
  QPersistentModelIndex *in_stack_fffffffffffffff0;
  QDebug *dbg_00;
  
  dbg_00 = *(QDebug **)(in_FS_OFFSET + 0x28);
  QDebug::QDebug(&local_18,in_RSI);
  ::operator<<(dbg_00,in_stack_fffffffffffffff0);
  QDebug::~QDebug(dbg_00);
  QDebug::~QDebug(dbg_00);
  if (*(QDebug **)(in_FS_OFFSET + 0x28) == dbg_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }